

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

matrix * __thiscall matrix::operator=(matrix *this,matrix *v)

{
  int iVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  int j;
  long lVar6;
  
  lVar2 = (long)v->nl_;
  this->nl_ = v->nl_;
  iVar1 = v->nc_;
  this->nc_ = iVar1;
  if (0 < lVar2) {
    pdVar3 = v->data_;
    pdVar4 = this->data_;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        pdVar4[lVar6] = pdVar3[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar2 != lVar6);
      lVar5 = lVar5 + 1;
      pdVar4 = pdVar4 + lVar2;
      pdVar3 = pdVar3 + iVar1;
    } while (lVar5 != lVar2);
  }
  return this;
}

Assistant:

matrix& matrix::operator= (const matrix& v){
    nl_ = v.get_nl();
    nc_ = v.get_nc();
    for(int i = 0; i < v.get_nl(); i++){
        for(int j = 0; j < v.get_nl(); j++){
            data_[i*get_nl()+j] = v(i, j);
        }
    }
    return *this;
}